

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestNetwork::~TestNetwork(TestNetwork *this)

{
  kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>::
  ~HashMap(&this->map);
  kj::
  Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
  ::~Table((Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
            *)this);
  return;
}

Assistant:

TestNetwork::~TestNetwork() noexcept(false) {}